

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O2

void iutest::detail::PrintToChar<signed_char>(char value,iu_ostream *os)

{
  ostream *poVar1;
  char str [2];
  char local_3a [2];
  string local_38;
  
  if (value != '\0') {
    if (value < ' ') {
      poVar1 = std::operator<<(os,"0x");
      ToHexString<signed_char>(&local_38,value);
      std::operator<<(poVar1,(string *)&local_38);
    }
    else {
      local_3a[1] = 0;
      local_3a[0] = value;
      poVar1 = std::operator<<(os,"\'");
      ShowAnyCString<signed_char>(&local_38,local_3a);
      poVar1 = std::operator<<(poVar1,(string *)&local_38);
      std::operator<<(poVar1,"\'");
    }
    std::__cxx11::string::~string((string *)&local_38);
    return;
  }
  std::operator<<(os,"\\0");
  return;
}

Assistant:

void PrintToChar(const T value, iu_ostream* os)
{
    // char or unsigned char の時に、 0 が NULL 文字にならないように修正
    if( value == 0 )
    {
        *os << "\\0";
    }
    else if( static_cast<int>(value) < 0x20 )
    {
        *os << "0x" << ToHexString(value);
    }
    else
    {
        const T str[2] = { value, 0 };
        *os << "\'" << detail::ShowAnyCString(str) << "\'";
    }
}